

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexResult> * __thiscall
wasm::WATParser::anon_unknown_10::idchar
          (optional<wasm::WATParser::(anonymous_namespace)::LexResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in)

{
  string_view in_00;
  bool bVar1;
  byte bVar2;
  uint8_t c;
  undefined1 local_30 [8];
  LexCtx ctx;
  string_view in_local;
  
  in_00._M_str = (char *)in._M_len;
  in_00._M_len = (size_t)this;
  ctx.lexedSize = (size_t)this;
  LexCtx::LexCtx((LexCtx *)local_30,in_00);
  bVar1 = LexCtx::empty((LexCtx *)local_30);
  if (bVar1) {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::optional
              (__return_storage_ptr__);
  }
  else {
    bVar2 = LexCtx::peek((LexCtx *)local_30);
    if ((((bVar2 < 0x30) || (0x39 < bVar2)) && ((bVar2 < 0x41 || (0x5a < bVar2)))) &&
       ((bVar2 < 0x61 || (0x7a < bVar2)))) {
      switch(bVar2) {
      case 0x21:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x2a:
      case 0x2b:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x3a:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x5c:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x7c:
      case 0x7e:
        LexCtx::take((LexCtx *)local_30,1);
      }
    }
    else {
      LexCtx::take((LexCtx *)local_30,1);
    }
    LexCtx::lexed(__return_storage_ptr__,(LexCtx *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexResult> idchar(std::string_view in) {
  LexCtx ctx(in);
  if (ctx.empty()) {
    return {};
  }
  uint8_t c = ctx.peek();
  if (('0' <= c && c <= '9') || ('A' <= c && c <= 'Z') ||
      ('a' <= c && c <= 'z')) {
    ctx.take(1);
  } else {
    switch (c) {
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '*':
      case '+':
      case '-':
      case '.':
      case '/':
      case ':':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case '\\':
      case '^':
      case '_':
      case '`':
      case '|':
      case '~':
        ctx.take(1);
    }
  }
  return ctx.lexed();
}